

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

void __thiscall
rr::SingleSampleLineRasterizer::rasterize
          (SingleSampleLineRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  Vec4 *a;
  Vec4 *b;
  int *piVar1;
  int iVar2;
  int iVar3;
  FragmentPacket *pFVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  int iVar16;
  int iVar17;
  IVec2 fragmentPos;
  Vec4 b0;
  Vector<long,_2> pa;
  Vector<float,_2> local_110;
  undefined8 uStack_108;
  float *local_100;
  FragmentPacket *local_f8;
  IVec2 minorDirection;
  Vector<long,_2> widthOffset;
  Vector<long,_2> pr;
  SubpixelLineSegment line;
  Vec4 b1;
  Vector<long,_2> diamondPosition;
  Vector<long,_2> pb;
  Vec4 ooSum;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  
  local_f8 = fragmentPackets;
  if (this->m_lineWidth <= 1.0) {
    iVar6 = 1;
  }
  else {
    fVar12 = floorf(this->m_lineWidth + 0.5);
    iVar6 = (int)fVar12;
  }
  a = &this->m_v1;
  b = &this->m_v0;
  tcu::operator-((tcu *)&line,a,b);
  fVar12 = -(float)line.m_v0.m_data[0];
  if (-(float)line.m_v0.m_data[0] <= (float)line.m_v0.m_data[0]) {
    fVar12 = (float)line.m_v0.m_data[0];
  }
  tcu::operator-((tcu *)&widthOffset,a,b);
  fVar15 = -widthOffset.m_data[0]._4_4_;
  if (-widthOffset.m_data[0]._4_4_ <= widthOffset.m_data[0]._4_4_) {
    fVar15 = widthOffset.m_data[0]._4_4_;
  }
  bVar5 = fVar15 <= fVar12;
  if (bVar5) {
    minorDirection.m_data[0] = 0;
    minorDirection.m_data[1] = 1;
  }
  else {
    minorDirection.m_data[0] = 1;
    minorDirection.m_data[1] = 0;
  }
  iVar2 = (this->m_viewport).m_data[bVar5];
  iVar3 = (this->m_viewport).m_data[(ulong)bVar5 + 2];
  tcu::Vector<int,_2>::cast<long>(&minorDirection);
  tcu::operator-(&pa);
  tcu::operator*((long)(iVar6 * 0x100 + -0x100 >> 1),&line.m_v0);
  pb.m_data[1] = 0x100000000;
  pb.m_data[0] = (long)b;
  tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_4,_2> *)&pb);
  fVar13 = (float)((ulong)diamondPosition.m_data[0] >> 0x20);
  uVar10 = -(uint)((float)diamondPosition.m_data[0] < 0.0);
  uVar11 = -(uint)(fVar13 < 0.0);
  line.m_v0.m_data[0] =
       (long)((float)diamondPosition.m_data[0] * 256.0 +
             (float)(~uVar10 & 0x3f000000 | uVar10 & 0xbf000000));
  line.m_v0.m_data[1] = (long)(fVar13 * 256.0 + (float)(~uVar11 & 0x3f000000 | uVar11 & 0xbf000000))
  ;
  tcu::operator+(&line.m_v0,&widthOffset);
  diamondPosition.m_data[1] = 0x100000000;
  diamondPosition.m_data[0] = (long)a;
  tcu::VecAccess::operator_cast_to_Vector((VecAccess<float,_4,_2> *)&diamondPosition);
  fVar13 = (float)((ulong)pr.m_data[0] >> 0x20);
  uVar10 = -(uint)((float)pr.m_data[0] < 0.0);
  uVar11 = -(uint)(fVar13 < 0.0);
  line.m_v0.m_data[0] =
       (long)((float)pr.m_data[0] * 256.0 + (float)(~uVar10 & 0x3f000000 | uVar10 & 0xbf000000));
  line.m_v0.m_data[1] = (long)(fVar13 * 256.0 + (float)(~uVar11 & 0x3f000000 | uVar11 & 0xbf000000))
  ;
  tcu::operator+(&line.m_v0,&widthOffset);
  LineRasterUtil::SubpixelLineSegment::SubpixelLineSegment(&line,&pa,&pb);
  iVar7 = 0;
  local_100 = depthValues;
  do {
    iVar17 = (this->m_curPos).m_data[1];
    if (((this->m_bboxMax).m_data[1] < iVar17) || (maxFragmentPackets <= iVar7)) {
      *numPacketsRasterized = iVar7;
      return;
    }
    iVar16 = (this->m_curPos).m_data[0] << 8;
    iVar17 = iVar17 << 8;
    pr.m_data[0] = CONCAT44(-(uint)(iVar16 < 0),iVar16);
    line.m_v0.m_data[0] = CONCAT44(-(uint)(iVar17 < 0),iVar17);
    b0.m_data[0] = 1.79366e-43;
    b0.m_data[1] = 0.0;
    b0.m_data[2] = 1.79366e-43;
    b0.m_data[3] = 0.0;
    tcu::operator+(&pr,(Vector<long,_2> *)&b0);
    bVar5 = LineRasterUtil::doesLineSegmentExitDiamond(&line,&diamondPosition);
    if (bVar5) {
      tcu::Vector<long,_2>::Vector(&pr,&diamondPosition);
      tcu::operator-(&pr,&pa);
      tcu::Vector<long,_2>::cast<float>((Vector<long,_2> *)&b0);
      tcu::operator-(&pb,&pa);
      tcu::Vector<long,_2>::cast<float>((Vector<long,_2> *)&b1);
      fVar13 = tcu::dot<float,2>((Vector<float,_2> *)&ooSum,&local_110);
      tcu::Vector<long,_2>::cast<float>(&pb);
      tcu::Vector<long,_2>::cast<float>(&pa);
      tcu::operator-(&local_38,&local_40);
      fVar14 = tcu::lengthSquared<float,2>((Vector<float,_2> *)&fragmentPos);
      fVar13 = fVar13 / fVar14;
      iVar17 = (this->m_curPos).m_data[fVar15 <= fVar12];
      iVar16 = iVar2 - iVar17;
      if (iVar16 < 1) {
        iVar16 = 0;
      }
      iVar17 = (iVar3 + iVar2) - iVar17;
      if (iVar6 <= iVar17) {
        iVar17 = iVar6;
      }
      iVar8 = this->m_curRowFragment;
      iVar9 = iVar7 * 4;
      while (iVar8 + iVar16 < iVar17) {
        tcu::operator*(iVar8 + iVar16,&minorDirection);
        tcu::operator+(&this->m_curPos,(Vector<int,_2> *)&b0);
        if (depthValues != (float *)0x0) {
          depthValues[iVar9] =
               (this->m_v0).m_data[2] * (1.0 - fVar13) + (this->m_v1).m_data[2] * fVar13;
          depthValues[iVar9 + 1] = 0.0;
          depthValues[iVar9 + 2] = 0.0;
          depthValues[iVar9 + 3] = 0.0;
        }
        tcu::Vector<float,_4>::Vector(&b0,1.0 - fVar13);
        tcu::Vector<float,_4>::Vector(&b1,fVar13);
        tcu::operator+((tcu *)&local_110,&b0,&b1);
        tcu::operator/((tcu *)&ooSum,1.0,(Vector<float,_4> *)&local_110);
        pFVar4 = local_f8;
        *&local_f8[iVar7].position.m_data = fragmentPos.m_data;
        local_f8[iVar7].coverage = 1;
        tcu::operator*((tcu *)&local_110,&b0,(Vector<float,_4> *)&ooSum);
        *(float (*) [2])pFVar4[iVar7].barycentric[0].m_data = local_110.m_data;
        *(undefined8 *)(pFVar4[iVar7].barycentric[0].m_data + 2) = uStack_108;
        tcu::operator*((tcu *)&local_110,&b1,(Vector<float,_4> *)&ooSum);
        *(float (*) [2])pFVar4[iVar7].barycentric[1].m_data = local_110.m_data;
        *(undefined8 *)(pFVar4[iVar7].barycentric[1].m_data + 2) = uStack_108;
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_110,0.0);
        *(float (*) [2])pFVar4[iVar7].barycentric[2].m_data = local_110.m_data;
        *(undefined8 *)(pFVar4[iVar7].barycentric[2].m_data + 2) = uStack_108;
        if ((1 - maxFragmentPackets) + iVar7 == 0) {
          this->m_curRowFragment = this->m_curRowFragment + 1;
          *numPacketsRasterized = maxFragmentPackets;
          return;
        }
        iVar8 = this->m_curRowFragment + 1;
        this->m_curRowFragment = iVar8;
        iVar9 = iVar9 + 4;
        iVar7 = iVar7 + 1;
        depthValues = local_100;
      }
      this->m_curRowFragment = 0;
    }
    iVar17 = (this->m_curPos).m_data[0] + 1;
    (this->m_curPos).m_data[0] = iVar17;
    if ((this->m_bboxMax).m_data[0] < iVar17) {
      piVar1 = (this->m_curPos).m_data + 1;
      *piVar1 = *piVar1 + 1;
      (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
    }
  } while( true );
}

Assistant:

void SingleSampleLineRasterizer::rasterize (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64								halfPixel			= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	const deInt32								lineWidth			= (m_lineWidth > 1.0f) ? deFloorFloatToInt32(m_lineWidth + 0.5f) : 1;
	const bool									isXMajor			= de::abs((m_v1 - m_v0).x()) >= de::abs((m_v1 - m_v0).y());
	const tcu::IVec2							minorDirection		= (isXMajor) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));
	const int									minViewportLimit	= (isXMajor) ? (m_viewport.y()) : (m_viewport.x());
	const int									maxViewportLimit	= (isXMajor) ? (m_viewport.y() + m_viewport.w()) : (m_viewport.x() + m_viewport.z());
	const tcu::Vector<deInt64,2>				widthOffset			= -minorDirection.cast<deInt64>() * (toSubpixelCoord(lineWidth - 1) / 2);
	const tcu::Vector<deInt64,2>				pa					= LineRasterUtil::toSubpixelVector(m_v0.xy()) + widthOffset;
	const tcu::Vector<deInt64,2>				pb					= LineRasterUtil::toSubpixelVector(m_v1.xy()) + widthOffset;
	const LineRasterUtil::SubpixelLineSegment	line				= LineRasterUtil::SubpixelLineSegment(pa, pb);

	int											packetNdx			= 0;

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const tcu::Vector<deInt64,2> diamondPosition = LineRasterUtil::toSubpixelVector(m_curPos) + tcu::Vector<deInt64,2>(halfPixel,halfPixel);

		// Should current fragment be drawn? == does the segment exit this diamond?
		if (LineRasterUtil::doesLineSegmentExitDiamond(line, diamondPosition))
		{
			const tcu::Vector<deInt64,2>	pr					= diamondPosition;
			const float						t					= tcu::dot((pr - pa).asFloat(), (pb - pa).asFloat()) / tcu::lengthSquared(pb.asFloat() - pa.asFloat());

			// Rasterize on only fragments that are would end up in the viewport (i.e. visible)
			const int						fragmentLocation	= (isXMajor) ? (m_curPos.y()) : (m_curPos.x());
			const int						rowFragBegin		= de::max(0, minViewportLimit - fragmentLocation);
			const int						rowFragEnd			= de::min(maxViewportLimit - fragmentLocation, lineWidth);

			// Wide lines require multiple fragments.
			for (; rowFragBegin + m_curRowFragment < rowFragEnd; m_curRowFragment++)
			{
				const int			replicationId	= rowFragBegin + m_curRowFragment;
				const tcu::IVec2	fragmentPos		= m_curPos + minorDirection * replicationId;

				// We only rasterize visible area
				DE_ASSERT(LineRasterUtil::inViewport(fragmentPos, m_viewport));

				// Compute depth values.
				if (depthValues)
				{
					const float za = m_v0.z();
					const float zb = m_v1.z();

					depthValues[packetNdx*4+0] = (1 - t) * za + t * zb;
					depthValues[packetNdx*4+1] = 0;
					depthValues[packetNdx*4+2] = 0;
					depthValues[packetNdx*4+3] = 0;
				}

				{
					// output this fragment
					// \note In order to make consistent output with multisampled line rasterization, output "barycentric" coordinates
					FragmentPacket& packet = fragmentPackets[packetNdx];

					const tcu::Vec4		b0		= tcu::Vec4(1 - t);
					const tcu::Vec4		b1		= tcu::Vec4(t);
					const tcu::Vec4		ooSum	= 1.0f / (b0 + b1);

					packet.position			= fragmentPos;
					packet.coverage			= getCoverageBit(1, 0, 0, 0);
					packet.barycentric[0]	= b0 * ooSum;
					packet.barycentric[1]	= b1 * ooSum;
					packet.barycentric[2]	= tcu::Vec4(0.0f);

					packetNdx += 1;
				}

				if (packetNdx == maxFragmentPackets)
				{
					m_curRowFragment++; // don't redraw this fragment again next time
					numPacketsRasterized = packetNdx;
					return;
				}
			}

			m_curRowFragment = 0;
		}

		++m_curPos.x();
		if (m_curPos.x() > m_bboxMax.x())
		{
			++m_curPos.y();
			m_curPos.x() = m_bboxMin.x();
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}